

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcPile::IfcPile(IfcPile *this)

{
  *(undefined ***)&this->field_0x1a0 = &PTR__Object_008a0070;
  *(undefined8 *)&this->field_0x1a8 = 0;
  *(char **)&this->field_0x1b0 = "IfcPile";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00930028);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x92fef8;
  *(undefined8 *)&this->field_0x1a0 = 0x930010;
  *(undefined8 *)&this->field_0x88 = 0x92ff20;
  *(undefined8 *)&this->field_0x98 = 0x92ff48;
  *(undefined8 *)&this->field_0xd0 = 0x92ff70;
  *(undefined8 *)&this->field_0x100 = 0x92ff98;
  *(undefined8 *)&this->field_0x138 = 0x92ffc0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0x92ffe8;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPile,_2UL>).field_0x20 = 0;
  (this->ConstructionType).ptr._M_dataplus._M_p = (pointer)&(this->ConstructionType).ptr.field_2;
  (this->ConstructionType).ptr._M_string_length = 0;
  (this->ConstructionType).ptr.field_2._M_local_buf[0] = '\0';
  (this->ConstructionType).have = false;
  return;
}

Assistant:

IfcPile() : Object("IfcPile") {}